

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other_functions.h
# Opt level: O0

node * createNode(size_t key)

{
  node *this;
  node *pnVar1;
  node *node;
  size_t key_local;
  
  this = (node *)malloc(0x20);
  std::__atomic_base<unsigned_long>::operator=((__atomic_base<unsigned_long> *)this,key);
  pnVar1 = setNull((node *)0x0);
  std::atomic<node_*>::operator=(this->child,pnVar1);
  pnVar1 = setNull((node *)0x0);
  std::atomic<node_*>::operator=(this->child + 1,pnVar1);
  std::atomic<bool>::operator=(&this->readyToReplace,false);
  return this;
}

Assistant:

static struct node* createNode(size_t key)
{
    struct node* node = (struct node*) malloc(sizeof(struct node));
    node->markedKey = key;
    node->child[LC] = setNull(NULL);
    node->child[RC] = setNull(NULL);
    node->readyToReplace=false;
    return(node);
}